

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace.c
# Opt level: O2

parasail_result_t *
parasail_sw_trace(char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,
                 parasail_matrix_t *matrix)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  parasail_result_t *ppVar11;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  byte bVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  char *pcVar16;
  ulong size;
  int iVar17;
  int iVar18;
  ulong size_00;
  char *__format;
  ulong uVar19;
  int iVar20;
  int *piVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  int local_a4;
  int *local_88;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar16 = "_s2";
  }
  else {
    uVar26 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar16 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar16 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar16 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar16 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_00501320:
        ppVar11 = parasail_result_new_trace(_s1Len,s2Len,0x10,1);
        if (ppVar11 != (parasail_result_t *)0x0) {
          ppVar11->flag = ppVar11->flag | 0x1480104;
          size_00 = (ulong)(uint)s2Len;
          ptr = parasail_memalign_int(0x10,size_00);
          size = (ulong)(s2Len + 1);
          ptr_00 = parasail_memalign_int(0x10,size);
          ptr_01 = parasail_memalign_int(0x10,size);
          if (ptr_01 != (int *)0x0 && (ptr_00 != (int *)0x0 && ptr != (int *)0x0)) {
            piVar21 = ((ppVar11->field_4).rowcols)->score_row;
            if (matrix->type == 0) {
              local_88 = parasail_memalign_int(0x10,(long)_s1Len);
              uVar19 = 0;
              if (local_88 == (int *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar15 = 0;
              if (0 < _s1Len) {
                uVar15 = (ulong)(uint)_s1Len;
              }
              for (; uVar15 != uVar19; uVar19 = uVar19 + 1) {
                local_88[uVar19] = matrix->mapper[(byte)_s1[uVar19]];
              }
            }
            else {
              local_88 = (int *)0x0;
            }
            uVar24 = 1;
            uVar19 = (ulong)(uint)_s1Len;
            piVar4 = matrix->mapper;
            for (uVar15 = 0; size_00 != uVar15; uVar15 = uVar15 + 1) {
              ptr[uVar15] = piVar4[(byte)_s2[uVar15]];
            }
            *ptr_00 = 0;
            *ptr_01 = -0x40000000;
            for (; size != uVar24; uVar24 = uVar24 + 1) {
              ptr_00[uVar24] = 0;
              ptr_01[uVar24] = -0x40000000;
            }
            uVar8 = 0;
            if (0 < _s1Len) {
              uVar8 = _s1Len;
            }
            local_a4 = -0x40000000;
            for (uVar15 = 1; uVar15 != uVar8 + 1; uVar15 = uVar15 + 1) {
              uVar24 = uVar15 - 1;
              iVar2 = matrix->size;
              uVar6 = uVar24;
              if (matrix->type == 0) {
                uVar6 = (long)local_88[uVar15 - 1];
              }
              piVar4 = matrix->matrix;
              iVar17 = *ptr_00;
              *ptr_00 = 0;
              iVar13 = -0x40000000;
              iVar9 = 0;
              uVar22 = 0;
              while (size - 1 != uVar22) {
                iVar3 = ptr_00[uVar22 + 1];
                iVar25 = iVar3 - open;
                iVar20 = ptr_01[uVar22 + 1] - gap;
                iVar18 = iVar20;
                if (iVar20 < iVar25) {
                  iVar18 = iVar25;
                }
                ptr_01[uVar22 + 1] = iVar18;
                iVar10 = iVar9 - open;
                iVar14 = iVar13 - gap;
                iVar13 = iVar10;
                if (iVar10 <= iVar14) {
                  iVar13 = iVar14;
                }
                iVar17 = iVar17 + piVar4[(long)iVar2 * uVar6 + (long)ptr[uVar22]];
                iVar23 = iVar17;
                if (iVar17 <= iVar13) {
                  iVar23 = iVar13;
                }
                if (iVar23 <= iVar18) {
                  iVar23 = iVar18;
                }
                iVar9 = iVar23;
                if (iVar23 < 1) {
                  iVar9 = 0;
                }
                uVar1 = uVar22 + 1;
                ptr_00[uVar22 + 1] = iVar9;
                if (local_a4 < iVar9) {
                  uVar26 = uVar22 & 0xffffffff;
                  uVar19 = uVar24;
                }
                else {
                  bVar5 = (long)uVar1 <= (long)(int)uVar26;
                  if (bVar5 && iVar9 == local_a4) {
                    uVar19 = uVar24;
                  }
                  uVar19 = uVar19 & 0xffffffff;
                  if (bVar5 && iVar9 == local_a4) {
                    uVar26 = uVar22 & 0xffffffff;
                  }
                }
                if (local_a4 <= iVar9) {
                  local_a4 = iVar9;
                }
                bVar7 = ((iVar25 <= iVar20) << 5 | (iVar10 <= iVar14) << 3) + 0x28;
                *(byte *)((long)piVar21 + uVar22) = bVar7;
                bVar12 = 4;
                if (iVar9 != iVar17) {
                  bVar12 = (iVar9 == ptr_01[uVar22 + 1]) + 1;
                }
                if (iVar23 < 1) {
                  bVar12 = 0;
                }
                *(byte *)((long)piVar21 + uVar22) = bVar12 | bVar7;
                uVar22 = uVar1;
                iVar17 = iVar3;
              }
              piVar21 = (int *)((long)piVar21 + size_00);
            }
            ppVar11->score = local_a4;
            ppVar11->end_query = (int)uVar19;
            ppVar11->end_ref = (int)uVar26;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_88);
              return ppVar11;
            }
            return ppVar11;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar16 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_00501320;
        __format = "%s: %s must be > 0\n";
        pcVar16 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_trace",pcVar16);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict F = NULL;
    int8_t * restrict HT = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 16, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);
    HT = (int8_t* restrict)result->trace->trace_table;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!F) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    F[0] = NEG_INF_32;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = 0;
        F[j] = NEG_INF_32;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = 0;
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E    - gap;
            E    = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, 0);
            WH = MAX(WH, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
            if (WH > score) {
                end_query = i-1;
                end_ref = j-1;
            }
            else if (score == WH && j-1 < end_ref) {
                end_query = i-1;
                end_ref = j-1;
            }
            score = MAX(score,WH);
            HT[1LL*(i-1)*s2Len + (j-1)] = (F_opn > F_ext) ? PARASAIL_DIAG_F
                                                          : PARASAIL_DEL_F;
            HT[1LL*(i-1)*s2Len + (j-1)] |= (E_opn > E_ext) ? PARASAIL_DIAG_E
                                                           : PARASAIL_INS_E;
            HT[1LL*(i-1)*s2Len + (j-1)] |= (WH == H_dag) ? PARASAIL_DIAG
                                        : (WH == F[j])   ? PARASAIL_DEL
                                                         : PARASAIL_INS;
            if (0 == WH) {
                HT[1LL*(i-1)*s2Len + (j-1)] &= PARASAIL_ZERO_MASK;
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(F);
    parasail_free(H);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}